

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ArrayPtr<const_unsigned_char> __thiscall capnp::_::ListReader::asRawBytes(ListReader *this)

{
  uchar *ptr;
  bool bVar1;
  unsigned_long uVar2;
  ByteCount64 size;
  Fault local_60;
  Fault f;
  unsigned_short *local_50;
  undefined1 local_48 [8];
  DebugComparison<const_unsigned_short_&,_unsigned_int> _kjCondition;
  ListReader *this_local;
  
  _kjCondition._32_8_ = this;
  local_50 = (unsigned_short *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->structPointerCount);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_short_const&>::operator==
            ((DebugComparison<const_unsigned_short_&,_unsigned_int> *)local_48,
             (DebugExpression<unsigned_short_const&> *)&local_50,(uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar1) {
    ptr = this->ptr;
    uVar2 = upgradeBound<unsigned_long,unsigned_int>(this->elementCount);
    size = WireHelpers::roundBitsUpToBytes(uVar2 * this->structDataSize);
    _this_local = arrayPtr<unsigned_long,unsigned_char>(ptr,size);
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short_const&,unsigned_int>&,char_const(&)[51]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc53,FAILED,"structPointerCount == ZERO * POINTERS",
               "_kjCondition,\"Schema mismatch: Expected data only, got pointers.\"",
               (DebugComparison<const_unsigned_short_&,_unsigned_int> *)local_48,
               (char (*) [51])"Schema mismatch: Expected data only, got pointers.");
    kj::ArrayPtr<const_unsigned_char>::ArrayPtr((ArrayPtr<const_unsigned_char> *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  return _this_local;
}

Assistant:

kj::ArrayPtr<const byte> ListReader::asRawBytes() const {
  KJ_REQUIRE(structPointerCount == ZERO * POINTERS,
             "Schema mismatch: Expected data only, got pointers.") {
    return kj::ArrayPtr<const byte>();
  }

  return arrayPtr(reinterpret_cast<const byte*>(ptr),
      WireHelpers::roundBitsUpToBytes(
          upgradeBound<uint64_t>(elementCount) * (structDataSize / ELEMENTS)));
}